

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1RemoveFromHash(PgHdr1 *pPage)

{
  PCache1 *pPVar1;
  PgHdr1 **local_28;
  PgHdr1 **pp;
  PCache1 *pCache;
  uint h;
  PgHdr1 *pPage_local;
  
  pPVar1 = pPage->pCache;
  for (local_28 = pPVar1->apHash + pPage->iKey % pPVar1->nHash; *local_28 != pPage;
      local_28 = &(*local_28)->pNext) {
  }
  *local_28 = (*local_28)->pNext;
  pPVar1->nPage = pPVar1->nPage - 1;
  return;
}

Assistant:

static void pcache1RemoveFromHash(PgHdr1 *pPage){
  unsigned int h;
  PCache1 *pCache = pPage->pCache;
  PgHdr1 **pp;

  assert( sqlite3_mutex_held(pCache->pGroup->mutex) );
  h = pPage->iKey % pCache->nHash;
  for(pp=&pCache->apHash[h]; (*pp)!=pPage; pp=&(*pp)->pNext);
  *pp = (*pp)->pNext;

  pCache->nPage--;
}